

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

DWARFDie __thiscall llvm::DWARFUnit::getSibling(DWARFUnit *this,DWARFDebugInfoEntry *Die)

{
  uint32_t uVar1;
  pointer pDVar2;
  pointer pDVar3;
  uint32_t uVar4;
  ulong uVar5;
  pointer pDVar6;
  pointer pDVar7;
  DWARFDie DVar8;
  
  if (((Die == (DWARFDebugInfoEntry *)0x0) || (uVar1 = Die->Depth, uVar1 == 0)) ||
     (Die->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0)) {
LAB_00b46dfc:
    this = (DWARFUnit *)0x0;
    pDVar6 = (pointer)0x0;
  }
  else {
    uVar4 = getDIEIndex(this,Die);
    pDVar2 = (this->DieArray).
             super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (ulong)(uVar4 + 1) - 1;
    pDVar7 = pDVar2 + ((ulong)(uVar4 + 1) - 1);
    do {
      uVar5 = uVar5 + 1;
      if ((ulong)(((long)(this->DieArray).
                         super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) / 0x18) <= uVar5
         ) goto LAB_00b46dfc;
      pDVar6 = pDVar7 + 1;
      pDVar3 = pDVar7 + 1;
      pDVar7 = pDVar6;
    } while (pDVar3->Depth != uVar1);
  }
  DVar8.Die = pDVar6;
  DVar8.U = this;
  return DVar8;
}

Assistant:

DWARFDie DWARFUnit::getSibling(const DWARFDebugInfoEntry *Die) {
  if (!Die)
    return DWARFDie();
  uint32_t Depth = Die->getDepth();
  // Unit DIEs always have a depth of zero and never have siblings.
  if (Depth == 0)
    return DWARFDie();
  // NULL DIEs don't have siblings.
  if (Die->getAbbreviationDeclarationPtr() == nullptr)
    return DWARFDie();

  // Find the next DIE whose depth is the same as the Die's depth.
  for (size_t I = getDIEIndex(Die) + 1, EndIdx = DieArray.size(); I < EndIdx;
       ++I) {
    if (DieArray[I].getDepth() == Depth)
      return DWARFDie(this, &DieArray[I]);
  }
  return DWARFDie();
}